

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O0

void test_bson_writer_custom_realloc(void)

{
  byte bVar1;
  int local_2c;
  undefined8 uStack_28;
  int x;
  bson_t *b;
  size_t buflen;
  uint8_t *buf;
  bson_writer_t *writer;
  
  buflen = bson_malloc(0);
  b = (bson_t *)0x0;
  local_2c = 0;
  buf = (uint8_t *)bson_writer_new(&buflen,&b,0,test_bson_writer_custom_realloc_helper,&local_2c);
  bVar1 = bson_writer_begin(buf,&stack0xffffffffffffffd8);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
            ,0x2d,"test_bson_writer_custom_realloc","bson_writer_begin (writer, &b)");
    abort();
  }
  bVar1 = bson_append_utf8(uStack_28,"hello",0xffffffff,"world");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c"
            ,0x2f,"test_bson_writer_custom_realloc",
            "bson_append_utf8 (b, \"hello\", -1, \"world\", -1)");
    abort();
  }
  bson_writer_end(buf);
  bson_writer_destroy(buf);
  if (local_2c < 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)x > 0\n",0x35);
    abort();
  }
  bson_free(buflen);
  return;
}

Assistant:

static void
test_bson_writer_custom_realloc (void)
{
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc (0);
   size_t buflen = 0;
   bson_t *b;
   int x = 0;

   writer = bson_writer_new (
      &buf, &buflen, 0, test_bson_writer_custom_realloc_helper, &x);

   BSON_ASSERT (bson_writer_begin (writer, &b));

   BSON_ASSERT (bson_append_utf8 (b, "hello", -1, "world", -1));

   bson_writer_end (writer);

   bson_writer_destroy (writer);

   BSON_ASSERT_CMPINT (x, >, 0);

   bson_free (buf);
}